

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int UYVYToARGB(uint8_t *src_uyvy,int src_stride_uyvy,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_40;
  int local_3c;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_uyvy == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_uyvy = src_uyvy + ~height * src_stride_uyvy;
      src_stride_uyvy = -src_stride_uyvy;
    }
    local_40 = src_stride_uyvy;
    local_3c = dst_stride_argb;
    if (width * 4 == dst_stride_argb && width * 2 == src_stride_uyvy) {
      width = iVar1 * width;
      iVar1 = 1;
      local_40 = 0;
      local_3c = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x40);
    if ((width & 0xfU) == 0) {
      pcVar3 = UYVYToARGBRow_SSSE3;
    }
    else {
      pcVar3 = UYVYToARGBRow_Any_SSSE3;
    }
    if (iVar2 == 0) {
      pcVar3 = UYVYToARGBRow_C;
    }
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((width & 0x1fU) == 0) {
      pcVar4 = UYVYToARGBRow_AVX2;
    }
    else {
      pcVar4 = UYVYToARGBRow_Any_AVX2;
    }
    if (iVar2 == 0) {
      pcVar4 = pcVar3;
    }
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      (*pcVar4)(src_uyvy,dst_argb,&kYuvI601Constants,width);
      src_uyvy = src_uyvy + local_40;
      dst_argb = dst_argb + local_3c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int UYVYToARGB(const uint8_t* src_uyvy,
               int src_stride_uyvy,
               uint8_t* dst_argb,
               int dst_stride_argb,
               int width,
               int height) {
  int y;
  void (*UYVYToARGBRow)(const uint8_t* src_uyvy, uint8_t* dst_argb,
                        const struct YuvConstants* yuvconstants, int width) =
      UYVYToARGBRow_C;
  if (!src_uyvy || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uyvy = src_uyvy + (height - 1) * src_stride_uyvy;
    src_stride_uyvy = -src_stride_uyvy;
  }
  // Coalesce rows.
  if (src_stride_uyvy == width * 2 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_uyvy = dst_stride_argb = 0;
  }
#if defined(HAS_UYVYTOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    UYVYToARGBRow = UYVYToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      UYVYToARGBRow = UYVYToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_UYVYTOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    UYVYToARGBRow = UYVYToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      UYVYToARGBRow = UYVYToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_UYVYTOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    UYVYToARGBRow = UYVYToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      UYVYToARGBRow = UYVYToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_UYVYTOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    UYVYToARGBRow = UYVYToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      UYVYToARGBRow = UYVYToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_UYVYTOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    UYVYToARGBRow = UYVYToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      UYVYToARGBRow = UYVYToARGBRow_MSA;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    UYVYToARGBRow(src_uyvy, dst_argb, &kYuvI601Constants, width);
    src_uyvy += src_stride_uyvy;
    dst_argb += dst_stride_argb;
  }
  return 0;
}